

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Int_t * Acb_NtkFindDivs(Acb_Ntk_t *p,Vec_Int_t *vSupp,Vec_Bit_t *vBlock,int fVerbose)

{
  ulong uVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  char *__assertion;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(4000);
  p_00->pArray = piVar7;
  uVar5 = (p->vObjTrav).nSize;
  if ((int)uVar5 < 1) {
    uVar5 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar5) {
      piVar7 = (p->vObjTrav).pArray;
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc((long)(int)uVar5 << 2);
      }
      else {
        piVar7 = (int *)realloc(piVar7,(long)(int)uVar5 << 2);
      }
      (p->vObjTrav).pArray = piVar7;
      if (piVar7 == (int *)0x0) goto LAB_0036f061;
      (p->vObjTrav).nCap = uVar5;
    }
    if (0 < (int)uVar5) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar5 * 4);
    }
    (p->vObjTrav).nSize = uVar5;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (0 < vSupp->nSize) {
    lVar13 = 0;
    do {
      iVar6 = vSupp->pArray[lVar13];
      if (((long)iVar6 < 0) || ((p->vCis).nSize <= iVar6)) goto LAB_0036efdc;
      uVar5 = (p->vCis).pArray[iVar6];
      lVar9 = (long)(int)uVar5;
      if ((lVar9 < 0) || ((p->vObjTrav).nSize <= (int)uVar5)) goto LAB_0036efdc;
      (p->vObjTrav).pArray[lVar9] = p->nObjTravs;
      if (uVar5 == 0) {
        __assertion = "i>0";
        goto LAB_0036f00b;
      }
      uVar14 = (p->vObjWeight).nSize;
      if ((int)uVar14 < 1) goto LAB_0036effb;
      if (uVar14 <= uVar5) goto LAB_0036efdc;
      if (0 < (p->vObjWeight).pArray[lVar9]) {
        Vec_IntPush(p_00,uVar5);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < vSupp->nSize);
    uVar5 = (p->vObjTrav).nSize;
  }
  if ((int)uVar5 < 1) {
    uVar5 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar5) {
      piVar7 = (p->vObjTrav).pArray;
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc((long)(int)uVar5 << 2);
      }
      else {
        piVar7 = (int *)realloc(piVar7,(long)(int)uVar5 << 2);
      }
      (p->vObjTrav).pArray = piVar7;
      if (piVar7 == (int *)0x0) {
LAB_0036f061:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar5;
    }
    if (0 < (int)uVar5) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar5 * 4);
    }
    (p->vObjTrav).nSize = uVar5;
  }
  p->nObjTravs = p->nObjTravs + 1;
  uVar5 = (p->vObjType).nSize;
  uVar8 = (ulong)uVar5;
  if (1 < (int)uVar5) {
    uVar12 = 1;
    do {
      if ((long)(int)uVar8 <= (long)uVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar5 = (uint)(byte)(p->vObjType).pArray[uVar12];
      if ((4 < uVar5) || ((0x19U >> (uVar5 & 0x1f) & 1) == 0)) {
        if ((long)vBlock->nSize <= (long)uVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        uVar5 = (uint)uVar12;
        if (((uint)vBlock->pArray[uVar12 >> 5 & 0x7ffffff] >> (uVar5 & 0x1f) & 1) == 0) {
          uVar8 = (ulong)(p->vObjWeight).nSize;
          if ((long)uVar8 < 1) {
LAB_0036effb:
            __assertion = "Acb_NtkHasObjWeights(p)";
LAB_0036f00b:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
          }
          if (uVar8 <= uVar12) {
LAB_0036efdc:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((0 < (p->vObjWeight).pArray[uVar12]) &&
             (iVar6 = Acb_NtkFindDivs_rec(p,uVar5), iVar6 != 0)) {
            Vec_IntPush(p_00,uVar5);
          }
        }
      }
      uVar12 = uVar12 + 1;
      uVar8 = (ulong)(p->vObjType).nSize;
    } while ((long)uVar12 < (long)uVar8);
  }
  uVar5 = p_00->nSize;
  if (1 < (long)(int)uVar5) {
    piVar7 = p_00->pArray;
    uVar12 = 1;
    uVar8 = 0;
    do {
      uVar1 = uVar8 + 1;
      uVar11 = uVar8 & 0xffffffff;
      uVar10 = uVar12;
      do {
        iVar6 = piVar7[uVar10];
        if (((long)iVar6 < 0) || (uVar14 = (p->vObjWeight).nSize, (int)uVar14 <= iVar6))
        goto LAB_0036efdc;
        uVar2 = piVar7[(int)uVar11];
        if (((long)(int)uVar2 < 0) || (uVar14 <= uVar2)) goto LAB_0036efdc;
        piVar3 = (p->vObjWeight).pArray;
        uVar4 = uVar10 & 0xffffffff;
        if (piVar3[(int)uVar2] <= piVar3[iVar6]) {
          uVar4 = uVar11;
        }
        uVar11 = uVar4;
        uVar10 = uVar10 + 1;
      } while ((long)(int)uVar5 != uVar10);
      iVar6 = piVar7[uVar8];
      piVar7[uVar8] = piVar7[(int)uVar11];
      piVar7[(int)uVar11] = iVar6;
      uVar12 = uVar12 + 1;
      uVar8 = uVar1;
    } while (uVar1 != uVar5 - 1);
  }
  uVar14 = 3000;
  if ((int)uVar5 < 3000) {
    uVar14 = uVar5;
  }
  if (fVerbose != 0) {
    printf("Reducing divisor set from %d to ");
    printf("%d.\n",(ulong)uVar14);
  }
  p_00->nSize = uVar14;
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindDivs( Acb_Ntk_t * p, Vec_Int_t * vSupp, Vec_Bit_t * vBlock, int fVerbose )
{
    int fPrintWeights = 0;
    int nDivLimit = 3000;
    int i, iObj;
    Vec_Int_t * vDivs = Vec_IntAlloc( 1000 );
    // mark inputs
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCiVec( vSupp, p, iObj, i )
    {
        Acb_ObjSetTravIdCur( p, iObj );
        if ( Acb_ObjWeight(p, iObj) > 0 )
            Vec_IntPush( vDivs, iObj );
    }
    // collect nodes whose support is contained in vSupp
    Acb_NtkIncTravId( p );
    Acb_NtkForEachNode( p, iObj )
        if ( !Vec_BitEntry(vBlock, iObj) && Acb_ObjWeight(p, iObj) > 0 && Acb_NtkFindDivs_rec(p, iObj) )
            Vec_IntPush( vDivs, iObj );
    // sort divisors by cost (first cheap ones; later expensive ones)
    Vec_IntSelectSortCost( Vec_IntArray(vDivs), Vec_IntSize(vDivs), &p->vObjWeight );
    //Vec_IntPrint( vDivs );
    nDivLimit = Abc_MinInt( Vec_IntSize(vDivs), nDivLimit );
    if ( fPrintWeights )
    {
//        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
//            printf( "%d:%d (w=%d)   ", i, iObj, Vec_IntEntry(&p->vObjWeight, iObj) );
//        printf( "\n" );

        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 100) % 10 );
        printf( "\n" );
        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 10) % 10 );
        printf( "\n" );
        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 1) % 10 );
        printf( "\n" );
    }
    if ( fVerbose )
    printf( "Reducing divisor set from %d to ", Vec_IntSize(vDivs) );
    Vec_IntShrink( vDivs, nDivLimit );
    if ( fVerbose )
    printf( "%d.\n", Vec_IntSize(vDivs) );
    return vDivs;
}